

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

void Abc_AigUpdateLevel_int(Abc_Aig_t *pMan)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar3;
  int local_38;
  int local_34;
  int v;
  int k;
  int i;
  int LevelNew;
  Vec_Ptr_t *vVec;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode;
  Abc_Aig_t *pMan_local;
  
  v = 0;
  do {
    iVar1 = Vec_VecSize(pMan->vLevels);
    if (iVar1 <= v) {
      return;
    }
    p = Vec_VecEntry(pMan->vLevels,v);
    iVar1 = Vec_PtrSize(p);
    if (iVar1 != 0) {
      for (local_34 = 0; iVar1 = Vec_PtrSize(p), local_34 < iVar1; local_34 = local_34 + 1) {
        pObj = (Abc_Obj_t *)Vec_PtrEntry(p,local_34);
        if (pObj != (Abc_Obj_t *)0x0) {
          iVar1 = Abc_ObjIsNode(pObj);
          if (iVar1 == 0) {
            __assert_fail("Abc_ObjIsNode(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                          ,0x425,"void Abc_AigUpdateLevel_int(Abc_Aig_t *)");
          }
          if (*(uint *)&pObj->field_0x14 >> 0xc != v) {
            __assert_fail("(int)pNode->Level == i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                          ,0x426,"void Abc_AigUpdateLevel_int(Abc_Aig_t *)");
          }
          if ((*(uint *)&pObj->field_0x14 >> 4 & 1) != 1) {
            __assert_fail("pNode->fMarkA == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                          ,0x428,"void Abc_AigUpdateLevel_int(Abc_Aig_t *)");
          }
          *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffef;
          for (local_38 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_38 < iVar1;
              local_38 = local_38 + 1) {
            pObj_00 = Abc_ObjFanout(pObj,local_38);
            iVar1 = Abc_ObjIsCo(pObj_00);
            if (iVar1 == 0) {
              pAVar3 = Abc_ObjFanin0(pObj_00);
              uVar2 = *(uint *)&pAVar3->field_0x14;
              pAVar3 = Abc_ObjFanin1(pObj_00);
              iVar1 = Abc_MaxInt(uVar2 >> 0xc,*(uint *)&pAVar3->field_0x14 >> 0xc);
              uVar2 = iVar1 + 1;
              if ((int)uVar2 <= v) {
                __assert_fail("LevelNew > i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                              ,0x431,"void Abc_AigUpdateLevel_int(Abc_Aig_t *)");
              }
              if (*(uint *)&pObj_00->field_0x14 >> 0xc != uVar2) {
                if ((*(uint *)&pObj_00->field_0x14 >> 4 & 1) != 0) {
                  Abc_AigRemoveFromLevelStructure(pMan->vLevels,pObj_00);
                }
                *(uint *)&pObj_00->field_0x14 =
                     *(uint *)&pObj_00->field_0x14 & 0xfff | uVar2 * 0x1000;
                if ((*(uint *)&pObj_00->field_0x14 >> 4 & 1) != 0) {
                  __assert_fail("pFanout->fMarkA == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                                ,0x43a,"void Abc_AigUpdateLevel_int(Abc_Aig_t *)");
                }
                *(uint *)&pObj_00->field_0x14 = *(uint *)&pObj_00->field_0x14 & 0xffffffef | 0x10;
                Vec_VecPush(pMan->vLevels,*(uint *)&pObj_00->field_0x14 >> 0xc,pObj_00);
              }
            }
          }
        }
      }
      Vec_PtrClear(p);
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Abc_AigUpdateLevel_int( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pNode, * pFanout;
    Vec_Ptr_t * vVec;
    int LevelNew, i, k, v;

    // go through the nodes and update the level of their fanouts
    Vec_VecForEachLevel( pMan->vLevels, vVec, i )
    {
        if ( Vec_PtrSize(vVec) == 0 )
            continue;
        Vec_PtrForEachEntry( Abc_Obj_t *, vVec, pNode, k )
        {
            if ( pNode == NULL )
                continue;
            assert( Abc_ObjIsNode(pNode) );
            assert( (int)pNode->Level == i );
            // clean the mark
            assert( pNode->fMarkA == 1 );
            pNode->fMarkA = 0;
            // iterate through the fanouts
            Abc_ObjForEachFanout( pNode, pFanout, v )
            {
                if ( Abc_ObjIsCo(pFanout) )
                    continue;
                // get the new level of this fanout
                LevelNew = 1 + Abc_MaxInt( Abc_ObjFanin0(pFanout)->Level, Abc_ObjFanin1(pFanout)->Level );
                assert( LevelNew > i );
                if ( (int)pFanout->Level == LevelNew ) // no change
                    continue;
                // if the fanout is present in the data structure, pull it out
                if ( pFanout->fMarkA )
                    Abc_AigRemoveFromLevelStructure( pMan->vLevels, pFanout );
                // update the fanout level
                pFanout->Level = LevelNew;
                // add the fanout to the data structure to update its fanouts
                assert( pFanout->fMarkA == 0 );
                pFanout->fMarkA = 1;
                Vec_VecPush( pMan->vLevels, pFanout->Level, pFanout );
            }
        }
        Vec_PtrClear( vVec );
    }
}